

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_15::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  pointer pTVar2;
  pointer pTVar3;
  Index type_index;
  Location loc;
  Type local_a0;
  Location local_98;
  Var local_78;
  
  local_a0 = sig_type;
  if (sig_type.enum_ < Any) {
    decl->has_func_type = false;
    pTVar2 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar2) {
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar2;
    }
    Type::GetInlineVector((TypeVector *)&local_98,&local_a0);
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98.filename._M_len;
    (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_98.filename._M_str;
    (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_98.field_1.field_1.offset;
    local_98.filename._M_len = 0;
    local_98.filename._M_str = (char *)0x0;
    local_98.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    if (pTVar2 != (pointer)0x0) {
      operator_delete(pTVar2,(long)pTVar3 - (long)pTVar2);
      if ((void *)local_98.filename._M_len != (void *)0x0) {
        operator_delete((void *)local_98.filename._M_len,
                        (long)local_98.field_1.field_1.offset - local_98.filename._M_len);
      }
    }
  }
  else {
    __s = this->filename_;
    aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    local_98.field_1.field_0.last_column = 0;
    local_98.filename._M_len = strlen(__s);
    local_98.filename._M_str = __s;
    local_98.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
    Var::Var(&local_78,sig_type.enum_,&local_98);
    SetFuncDeclaration(this,decl,&local_78);
    Var::~Var(&local_78);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (sig_type.IsIndex()) {
    Index type_index = sig_type.GetIndex();
    SetFuncDeclaration(decl, Var(type_index, GetLocation()));
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = sig_type.GetInlineVector();
  }
}